

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_inter_segment_id
               (AV1_COMP *cpi,MACROBLOCKD *xd,aom_writer *w,segmentation *seg,
               segmentation_probs *segp,int skip,int preskip)

{
  uint uVar1;
  segmentation *seg_00;
  aom_cdf_prob *paVar2;
  AV1_COMP *in_RCX;
  int *in_RSI;
  long in_RDI;
  MACROBLOCKD *in_R8;
  int in_R9D;
  int in_stack_00000008;
  aom_cdf_prob *pred_cdf;
  int pred_flag;
  int mi_col;
  int mi_row;
  AV1_COMMON *cm;
  MB_MODE_INFO *mbmi;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  segmentation_probs *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  int mi_col_00;
  aom_writer *w_00;
  undefined4 in_stack_ffffffffffffffd0;
  int skip_txfm;
  
  w_00 = (aom_writer *)**(undefined8 **)(in_RSI + 0x7ae);
  seg_00 = (segmentation *)(in_RDI + 0x3bf80);
  mi_col_00 = *in_RSI;
  iVar3 = in_RSI[1];
  if (*(char *)((long)&in_RCX->ppi + 1) == '\0') {
    return;
  }
  if (in_stack_00000008 == 0) {
    if ((char)(in_RCX->enc_quant_dequant_params).quants.y_quant[9][4] != '\0') {
      return;
    }
    if (in_R9D != 0) {
      write_segment_id(in_RCX,in_R8,(MB_MODE_INFO *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),w_00,
                       seg_00,(segmentation_probs *)CONCAT44(mi_col_00,iVar3),(int)in_RSI);
      if (*(char *)((long)&in_RCX->ppi + 3) == '\0') {
        return;
      }
      *(ushort *)&w_00[2].field_0x37 = *(ushort *)&w_00[2].field_0x37 & 0xfff7;
      return;
    }
  }
  else if ((char)(in_RCX->enc_quant_dequant_params).quants.y_quant[9][4] == '\0') {
    return;
  }
  if (*(char *)((long)&in_RCX->ppi + 3) == '\0') {
    write_segment_id(in_RCX,in_R8,(MB_MODE_INFO *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),w_00,
                     seg_00,(segmentation_probs *)CONCAT44(mi_col_00,iVar3),(int)in_RSI);
  }
  else {
    uVar1 = (uint)((byte)(*(ushort *)&w_00[2].field_0x37 >> 3) & 1);
    paVar2 = av1_get_pred_cdf_seg_id
                       (in_stack_ffffffffffffffa0,
                        (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                       );
    skip_txfm = (int)in_RSI;
    aom_write_symbol((aom_writer *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                     (int)((ulong)paVar2 >> 0x20),(aom_cdf_prob *)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff9c);
    if (uVar1 == 0) {
      write_segment_id(in_RCX,in_R8,(MB_MODE_INFO *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),w_00,
                       seg_00,(segmentation_probs *)CONCAT44(mi_col_00,iVar3),skip_txfm);
    }
    if (uVar1 != 0) {
      set_spatial_segment_id
                ((CommonModeInfoParams *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(uint8_t *)w_00,
                 (BLOCK_SIZE)((ulong)seg_00 >> 0x38),(int)seg_00,mi_col_00,
                 (uint8_t)((uint)iVar3 >> 0x18));
    }
  }
  return;
}

Assistant:

static inline void write_inter_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                          aom_writer *w,
                                          const struct segmentation *const seg,
                                          struct segmentation_probs *const segp,
                                          int skip, int preskip) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  AV1_COMMON *const cm = &cpi->common;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (seg->update_map) {
    if (preskip) {
      if (!seg->segid_preskip) return;
    } else {
      if (seg->segid_preskip) return;
      if (skip) {
        write_segment_id(cpi, xd, mbmi, w, seg, segp, 1);
        if (seg->temporal_update) mbmi->seg_id_predicted = 0;
        return;
      }
    }
    if (seg->temporal_update) {
      const int pred_flag = mbmi->seg_id_predicted;
      aom_cdf_prob *pred_cdf = av1_get_pred_cdf_seg_id(segp, xd);
      aom_write_symbol(w, pred_flag, pred_cdf, 2);
      if (!pred_flag) {
        write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);
      }
      if (pred_flag) {
        set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map,
                               mbmi->bsize, mi_row, mi_col, mbmi->segment_id);
      }
    } else {
      write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);
    }
  }
}